

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O3

Bool inRemovedInfo(uint tid)

{
  long lVar1;
  
  lVar1 = 8;
  do {
    if (*(uint *)((long)&html5Info[0].tag + lVar1) == tid) {
      return yes;
    }
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 200);
  return no;
}

Assistant:

Bool inRemovedInfo( uint tid )
{
    int i;
    for (i = 0; ; i++) {
        if (html5Info[i].tag == 0)
            break;
        if (html5Info[i].id == tid)
            return yes;
    }
    return no;
}